

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlCtxtReadMemory(xmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,
                           int options)

{
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (size < 0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options);
    input_00 = xmlCtxtNewInputFromMemory(ctxt,URL,buffer,(long)size,encoding,2);
    if (input_00 == (xmlParserInputPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)xmlCtxtParseDocument(ctxt,input_00);
    }
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

xmlDocPtr
xmlCtxtReadMemory(xmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (size < 0))
        return(NULL);

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromMemory(ctxt, URL, buffer, size, encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}